

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O2

void yajl_tree_free(yajl_val v)

{
  char *pcVar1;
  size_t __n;
  yajl_val *__ptr;
  size_t i;
  char *pcVar2;
  yajl_val *ppyVar3;
  anon_union_32_4_9ecb9ae1_for_u *paVar4;
  
  if (v == (yajl_val)0x0) {
    return;
  }
  switch(v->type) {
  case yajl_t_string:
    pcVar2 = (v->u).string;
    if (pcVar2 == (char *)0x0) {
      __n = 0;
    }
    else {
      __n = strlen(pcVar2);
    }
    paVar4 = &v->u;
    memset(pcVar2,0,__n);
    break;
  case yajl_t_number:
    paVar4 = (anon_union_32_4_9ecb9ae1_for_u *)&(v->u).number.r;
    break;
  case yajl_t_object:
    paVar4 = (anon_union_32_4_9ecb9ae1_for_u *)&(v->u).object.values;
    for (pcVar2 = (char *)0x0; pcVar2 < (v->u).number.r; pcVar2 = pcVar2 + 1) {
      free(*(void **)((v->u).string + (long)pcVar2 * 8));
      pcVar1 = (v->u).string + (long)pcVar2 * 8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      yajl_tree_free((v->u).object.values[(long)pcVar2]);
      (v->u).object.values[(long)pcVar2] = (yajl_val)0x0;
    }
    free((v->u).string);
    break;
  case yajl_t_array:
    for (ppyVar3 = (yajl_val *)0x0; __ptr = (yajl_val *)(v->u).string,
        ppyVar3 < (v->u).object.values; ppyVar3 = (yajl_val *)((long)ppyVar3 + 1)) {
      yajl_tree_free(__ptr[(long)ppyVar3]);
      pcVar2 = (v->u).string + (long)ppyVar3 * 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
    }
    goto LAB_00102956;
  default:
    goto switchD_001028bb_default;
  }
  __ptr = (yajl_val *)paVar4->string;
LAB_00102956:
  free(__ptr);
switchD_001028bb_default:
  free(v);
  return;
}

Assistant:

void yajl_tree_free (yajl_val v)
{
    if (v == NULL) return;

    if (YAJL_IS_STRING(v))
    {
        memset(v->u.string, 0, strlens(v->u.string));
        free(v->u.string);
        free(v);
    }
    else if (YAJL_IS_NUMBER(v))
    {
        free(v->u.number.r);
        free(v);
    }
    else if (YAJL_GET_OBJECT(v))
    {
        yajl_object_free(v);
    }
    else if (YAJL_GET_ARRAY(v))
    {
        yajl_array_free(v);
    }
    else /* if (yajl_t_true or yajl_t_false or yajl_t_null) */
    {
        free(v);
    }
}